

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

void Aig_NodeIntersectLists(Vec_Ptr_t *vArr1,Vec_Ptr_t *vArr2,Vec_Ptr_t *vArr)

{
  void **ppvVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  void **ppvVar5;
  void **ppvVar6;
  void **ppvVar7;
  void **ppvVar8;
  int iVar9;
  
  ppvVar7 = vArr1->pArray;
  ppvVar8 = vArr2->pArray;
  iVar4 = vArr1->nSize;
  iVar2 = vArr2->nSize;
  iVar9 = iVar2;
  if (iVar2 < iVar4) {
    iVar9 = iVar4;
  }
  if (vArr->nCap < iVar9) {
    if (vArr->pArray == (void **)0x0) {
      ppvVar5 = (void **)malloc((long)iVar9 << 3);
    }
    else {
      ppvVar5 = (void **)realloc(vArr->pArray,(long)iVar9 << 3);
    }
    vArr->pArray = ppvVar5;
    vArr->nCap = iVar9;
  }
  ppvVar5 = vArr->pArray;
  if (0 < iVar2 && 0 < iVar4) {
    ppvVar1 = ppvVar7 + iVar4;
    ppvVar6 = ppvVar8 + iVar2;
    do {
      pvVar3 = *ppvVar7;
      iVar4 = *(int *)((long)pvVar3 + 0x24);
      if (iVar4 == *(int *)((long)*ppvVar8 + 0x24)) {
        ppvVar7 = ppvVar7 + 1;
        *ppvVar5 = pvVar3;
        ppvVar5 = ppvVar5 + 1;
LAB_006188ef:
        ppvVar8 = ppvVar8 + 1;
      }
      else {
        if (*(int *)((long)*ppvVar8 + 0x24) <= iVar4) goto LAB_006188ef;
        ppvVar7 = ppvVar7 + 1;
      }
    } while ((ppvVar7 < ppvVar1) && (ppvVar8 < ppvVar6));
  }
  iVar4 = (int)((ulong)((long)ppvVar5 - (long)vArr->pArray) >> 3);
  vArr->nSize = iVar4;
  if (vArr->nCap < iVar4) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                  ,0x504,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (iVar4 <= vArr1->nSize) {
    if (iVar4 <= vArr2->nSize) {
      return;
    }
    __assert_fail("vArr->nSize <= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                  ,0x506,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  __assert_fail("vArr->nSize <= vArr1->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigUtil.c"
                ,0x505,"void Aig_NodeIntersectLists(Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_NodeIntersectLists( Vec_Ptr_t * vArr1, Vec_Ptr_t * vArr2, Vec_Ptr_t * vArr )
{
    Aig_Obj_t ** pBeg  = (Aig_Obj_t **)vArr->pArray;
    Aig_Obj_t ** pBeg1 = (Aig_Obj_t **)vArr1->pArray;
    Aig_Obj_t ** pBeg2 = (Aig_Obj_t **)vArr2->pArray;
    Aig_Obj_t ** pEnd1 = (Aig_Obj_t **)vArr1->pArray + vArr1->nSize;
    Aig_Obj_t ** pEnd2 = (Aig_Obj_t **)vArr2->pArray + vArr2->nSize;
    Vec_PtrGrow( vArr, Abc_MaxInt( Vec_PtrSize(vArr1), Vec_PtrSize(vArr2) ) );
    pBeg  = (Aig_Obj_t **)vArr->pArray;
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( (*pBeg1)->Id == (*pBeg2)->Id )
            *pBeg++ = *pBeg1++, pBeg2++;
        else if ( (*pBeg1)->Id < (*pBeg2)->Id )
//            *pBeg++ = *pBeg1++;
            pBeg1++;
        else 
//            *pBeg++ = *pBeg2++;
            pBeg2++;
    }
//    while ( pBeg1 < pEnd1 )
//        *pBeg++ = *pBeg1++;
//    while ( pBeg2 < pEnd2 )
//        *pBeg++ = *pBeg2++;
    vArr->nSize = pBeg - (Aig_Obj_t **)vArr->pArray;
    assert( vArr->nSize <= vArr->nCap );
    assert( vArr->nSize <= vArr1->nSize );
    assert( vArr->nSize <= vArr2->nSize );
}